

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# f2c_lite.c
# Opt level: O3

float f__cabs(float real,float imag)

{
  undefined1 auVar1 [16];
  float fVar2;
  uint in_XMM0_Db;
  float fVar3;
  uint in_XMM1_Db;
  float fVar6;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  
  auVar4._0_8_ = CONCAT44(imag,real) ^ 0x8000000080000000;
  auVar4._8_4_ = in_XMM0_Db ^ 0x80000000;
  auVar4._12_4_ = in_XMM1_Db ^ 0x80000000;
  auVar1._4_4_ = imag;
  auVar1._0_4_ = real;
  auVar1._8_4_ = in_XMM0_Db;
  auVar1._12_4_ = in_XMM1_Db;
  auVar5 = maxps(auVar4,auVar1);
  fVar3 = auVar5._0_4_;
  fVar6 = auVar5._4_4_;
  fVar2 = fVar6;
  if (fVar6 <= fVar3) {
    fVar2 = fVar3;
  }
  if ((fVar3 + fVar6 == fVar2) && (!NAN(fVar3 + fVar6) && !NAN(fVar2))) {
    return fVar2;
  }
  if (fVar6 <= fVar3) {
    auVar5._0_4_ = fVar6;
  }
  fVar3 = auVar5._0_4_ / fVar2;
  return SQRT(fVar3 * fVar3 + 1.0) * fVar2;
}

Assistant:

float
f__cabs(float real, float imag)
#endif
{
    float temp;

    if (real < 0)
        real = -real;
    if (imag < 0)
        imag = -imag;
    if (imag > real) {
        temp = real;
        real = imag;
        imag = temp;
    }
    if ((imag + real) == real)
        return ((float) real);

    temp = imag / real;
    temp = real * sqrt(1.0 + temp * temp);      /*overflow!! */
    return (temp);
}